

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group_impl.h
# Opt level: O2

void secp256k1_ge_set_gej_var(secp256k1_ge *r,secp256k1_gej *a)

{
  secp256k1_fe *r_00;
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  secp256k1_fe z3;
  secp256k1_fe z2;
  secp256k1_fe sStack_78;
  secp256k1_fe local_50;
  
  if (a->infinity == 0) {
    r->infinity = 0;
    r_00 = &a->z;
    secp256k1_fe_impl_inv_var(r_00,r_00);
    secp256k1_fe_impl_sqr(&local_50,r_00);
    secp256k1_fe_impl_mul(&sStack_78,r_00,&local_50);
    secp256k1_fe_impl_mul(&a->x,&a->x,&local_50);
    secp256k1_fe_impl_mul(&a->y,&a->y,&sStack_78);
    (a->z).n[0] = 1;
    (a->z).n[1] = 0;
    (a->z).n[2] = 0;
    (a->z).n[3] = 0;
    (a->z).n[4] = 0;
    r->infinity = 0;
    uVar1 = (a->x).n[1];
    uVar2 = (a->x).n[2];
    uVar3 = (a->x).n[3];
    (r->x).n[0] = (a->x).n[0];
    (r->x).n[1] = uVar1;
    (r->x).n[2] = uVar2;
    (r->x).n[3] = uVar3;
    (r->x).n[4] = (a->x).n[4];
    uVar1 = (a->y).n[1];
    uVar2 = (a->y).n[2];
    uVar3 = (a->y).n[3];
    (r->y).n[0] = (a->y).n[0];
    (r->y).n[1] = uVar1;
    (r->y).n[2] = uVar2;
    (r->y).n[3] = uVar3;
    (r->y).n[4] = (a->y).n[4];
  }
  else {
    r->infinity = 1;
    (r->x).n[0] = 0;
    (r->x).n[1] = 0;
    (r->x).n[2] = 0;
    (r->x).n[3] = 0;
    (r->x).n[4] = 0;
    (r->y).n[0] = 0;
    (r->y).n[1] = 0;
    (r->y).n[2] = 0;
    (r->y).n[3] = 0;
    (r->y).n[4] = 0;
  }
  return;
}

Assistant:

static void secp256k1_ge_set_gej_var(secp256k1_ge *r, secp256k1_gej *a) {
    secp256k1_fe z2, z3;
    SECP256K1_GEJ_VERIFY(a);

    if (secp256k1_gej_is_infinity(a)) {
        secp256k1_ge_set_infinity(r);
        return;
    }
    r->infinity = 0;
    secp256k1_fe_inv_var(&a->z, &a->z);
    secp256k1_fe_sqr(&z2, &a->z);
    secp256k1_fe_mul(&z3, &a->z, &z2);
    secp256k1_fe_mul(&a->x, &a->x, &z2);
    secp256k1_fe_mul(&a->y, &a->y, &z3);
    secp256k1_fe_set_int(&a->z, 1);
    secp256k1_ge_set_xy(r, &a->x, &a->y);

    SECP256K1_GEJ_VERIFY(a);
    SECP256K1_GE_VERIFY(r);
}